

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

int __thiscall
ft::list<int,_ft::allocator<int>_>::remove(list<int,_ft::allocator<int>_> *this,char *__filename)

{
  undefined1 local_50 [32];
  
  local_50._24_8_ = this->m_head->next;
  while ((listNode<int> *)local_50._24_8_ != this->m_tail) {
    if (((listNode<int> *)local_50._24_8_)->data == *(int *)__filename) {
      local_50._16_8_ = &PTR__listIterator_0010dd60;
      erase((list<int,_ft::allocator<int>_> *)local_50,(iterator *)this);
      local_50._24_8_ = local_50._8_8_;
    }
    else {
      local_50._24_8_ = ((listNode<int> *)local_50._24_8_)->next;
    }
  }
  return (int)local_50._24_8_;
}

Assistant:

void remove(value_type const & val) {
		iterator	it = this->begin();
		while (it != this->end()) {
			if (*it == val)
				it = this->erase(it);
			else
				++it;
		}
	}